

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

JavascriptFunction *
Js::TypedArrayBase::GetDefaultConstructor(Var object,ScriptContext *scriptContext)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this;
  RuntimeFunction *pRVar6;
  
  if (object == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00d5b822;
    *puVar5 = 0;
LAB_00d5b67b:
    this = UnsafeVarTo<Js::RecyclableObject>(object);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d5b822;
      *puVar5 = 0;
    }
    TVar1 = ((this->type).ptr)->typeId;
    if ((0x57 < (int)TVar1) && (BVar4 = RecyclableObject::IsExternal(this), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) goto LAB_00d5b822;
      *puVar5 = 0;
    }
    switch(TVar1) {
    case TypeIds_Int8Array:
      pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).Int8ArrayConstructor.ptr;
      break;
    case TypeIds_Uint8Array:
      pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).Uint8ArrayConstructor.ptr;
      break;
    case TypeIds_Uint8ClampedArray:
      pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).Uint8ClampedArrayConstructor.ptr;
      break;
    case TypeIds_Int16Array:
      pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).Int16ArrayConstructor.ptr;
      break;
    case TypeIds_Uint16Array:
      pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).Uint16ArrayConstructor.ptr;
      break;
    case TypeIds_Int32Array:
      pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).Int32ArrayConstructor.ptr;
      break;
    case TypeIds_Uint32Array:
      pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).Uint32ArrayConstructor.ptr;
      break;
    case TypeIds_Float32Array:
      pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).Float32ArrayConstructor.ptr;
      break;
    case TypeIds_Float64Array:
      pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).Float64ArrayConstructor.ptr;
      break;
    default:
      goto switchD_00d5b766_default;
    }
  }
  else {
    if (((ulong)object & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)object & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)object >> 0x32 == 0 && ((ulong)object & 0xffff000000000000) != 0x1000000000000)
      goto LAB_00d5b67b;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d5b822;
      *puVar5 = 0;
    }
switchD_00d5b766_default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x9b5,"((0))","UNREACHED");
    if (!bVar3) {
LAB_00d5b822:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pRVar6 = (RuntimeFunction *)0x0;
  }
  return &pRVar6->super_JavascriptFunction;
}

Assistant:

JavascriptFunction* TypedArrayBase::GetDefaultConstructor(Var object, ScriptContext* scriptContext)
    {
        switch (JavascriptOperators::GetTypeId(object))
        {
        case TypeId::TypeIds_Int8Array:
            return scriptContext->GetLibrary()->GetInt8ArrayConstructor();
        case TypeId::TypeIds_Uint8Array:
            return scriptContext->GetLibrary()->GetUint8ArrayConstructor();
        case TypeId::TypeIds_Uint8ClampedArray:
            return scriptContext->GetLibrary()->GetUint8ClampedArrayConstructor();
        case TypeId::TypeIds_Int16Array:
            return scriptContext->GetLibrary()->GetInt16ArrayConstructor();
        case TypeId::TypeIds_Uint16Array:
            return scriptContext->GetLibrary()->GetUint16ArrayConstructor();
        case TypeId::TypeIds_Int32Array:
            return scriptContext->GetLibrary()->GetInt32ArrayConstructor();
        case TypeId::TypeIds_Uint32Array:
            return scriptContext->GetLibrary()->GetUint32ArrayConstructor();
        case TypeId::TypeIds_Float32Array:
            return scriptContext->GetLibrary()->GetFloat32ArrayConstructor();
        case TypeId::TypeIds_Float64Array:
            return scriptContext->GetLibrary()->GetFloat64ArrayConstructor();
        default:
            Assert(UNREACHED);
            return nullptr;
        }
    }